

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mat * rf_mat_look_at(rf_mat *__return_storage_ptr__,rf_vec3 eye,rf_vec3 target,rf_vec3 up)

{
  rf_mat mat;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 in_stack_ffffffffffffff28 [12];
  float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  
  fVar12 = up.z;
  fVar10 = up.x;
  fVar11 = up.y;
  fVar8 = eye.z;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  fVar14 = eye.x - target.x;
  fVar15 = eye.y - target.y;
  fVar13 = fVar8 - target.z;
  fVar7 = fVar13 * fVar13 + fVar14 * fVar14 + fVar15 * fVar15;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
    in_stack_ffffffffffffff34 = fVar12;
    in_stack_ffffffffffffff48 = fVar10;
    in_stack_ffffffffffffff4c = fVar11;
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = (float)(-(uint)(fVar7 == 0.0) & 0x3f800000 | ~-(uint)(fVar7 == 0.0) & (uint)(1.0 / fVar7))
  ;
  fVar14 = fVar14 * fVar7;
  fVar15 = fVar15 * fVar7;
  fVar13 = fVar13 * fVar7;
  fVar9 = fVar11 * fVar13 - fVar15 * fVar12;
  fVar12 = fVar12 * fVar14 - fVar13 * fVar10;
  fVar10 = fVar10 * fVar15 - fVar14 * fVar11;
  fVar7 = fVar10 * fVar10 + fVar9 * fVar9 + fVar12 * fVar12;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
    in_stack_ffffffffffffff34 = fVar12;
    in_stack_ffffffffffffff48 = fVar10;
  }
  else {
    fVar7 = SQRT(fVar7);
    fVar11 = in_stack_ffffffffffffff4c;
  }
  fVar16 = (float)(-(uint)(fVar7 == 0.0) & 0x3f800000 | ~-(uint)(fVar7 == 0.0) & (uint)(1.0 / fVar7)
                  );
  fVar9 = fVar9 * fVar16;
  fVar12 = fVar12 * fVar16;
  fVar16 = fVar16 * fVar10;
  fVar10 = fVar15 * fVar16 - fVar13 * fVar12;
  fVar17 = fVar13 * fVar9 - fVar16 * fVar14;
  fVar18 = fVar14 * fVar12 + -fVar15 * fVar9;
  fVar7 = fVar18 * fVar18 + fVar10 * fVar10 + fVar17 * fVar17;
  if (fVar7 < 0.0) {
    fVar11 = 0.0;
    fVar7 = sqrtf(fVar7);
    in_stack_ffffffffffffff34 = fVar12;
    in_stack_ffffffffffffff3c = fVar18;
    in_stack_ffffffffffffff40 = fVar17;
    in_stack_ffffffffffffff48 = fVar16;
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  fVar7 = (float)(-(uint)(fVar7 == 0.0) & 0x3f800000 | ~-(uint)(fVar7 == 0.0) & (uint)(1.0 / fVar7))
  ;
  __return_storage_ptr__->m0 = fVar9;
  __return_storage_ptr__->m1 = fVar12;
  __return_storage_ptr__->m2 = fVar16;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m4 = fVar10 * fVar7;
  __return_storage_ptr__->m5 = fVar17 * fVar7;
  __return_storage_ptr__->m6 = fVar7 * fVar18;
  __return_storage_ptr__->m8 = fVar14;
  __return_storage_ptr__->m9 = fVar15;
  __return_storage_ptr__->m10 = fVar13;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  __return_storage_ptr__->m12 = eye.x;
  __return_storage_ptr__->m13 = eye.y;
  __return_storage_ptr__->m14 = fVar8;
  uVar1 = __return_storage_ptr__->m10;
  uVar2 = __return_storage_ptr__->m14;
  uVar3 = __return_storage_ptr__->m3;
  uVar4 = __return_storage_ptr__->m7;
  uVar5 = __return_storage_ptr__->m11;
  uVar6 = __return_storage_ptr__->m15;
  mat.m5 = (float)uVar6;
  mat.m1 = (float)uVar5;
  mat.m12 = (float)uVar4;
  mat.m8 = (float)uVar3;
  mat.m4 = (float)uVar2;
  mat.m0 = (float)uVar1;
  mat.m9 = (float)in_stack_ffffffffffffff28._0_4_;
  mat.m13 = (float)in_stack_ffffffffffffff28._4_4_;
  mat.m2 = (float)in_stack_ffffffffffffff28._8_4_;
  mat.m6 = in_stack_ffffffffffffff34;
  mat.m10 = fVar13;
  mat.m14 = in_stack_ffffffffffffff3c;
  mat.m3 = in_stack_ffffffffffffff40;
  mat.m7 = fVar8;
  mat.m11 = in_stack_ffffffffffffff48;
  mat.m15 = fVar11;
  rf_mat_invert(mat);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mat rf_mat_look_at(rf_vec3 eye, rf_vec3 target, rf_vec3 up)
{
    rf_mat result = {0};

    rf_vec3 z = rf_vec3_sub(eye, target);
    z = rf_vec3_normalize(z);
    rf_vec3 x = rf_vec3_cross_product(up, z);
    x = rf_vec3_normalize(x);
    rf_vec3 y = rf_vec3_cross_product(z, x);
    y = rf_vec3_normalize(y);

    result.m0 = x.x;
    result.m1 = x.y;
    result.m2 = x.z;
    result.m3 = 0.0f;
    result.m4 = y.x;
    result.m5 = y.y;
    result.m6 = y.z;
    result.m7 = 0.0f;
    result.m8 = z.x;
    result.m9 = z.y;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = eye.x;
    result.m13 = eye.y;
    result.m14 = eye.z;
    result.m15 = 1.0f;

    result = rf_mat_invert(result);

    return result;
}